

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int a_00;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  stbi_uc *psVar11;
  long lVar12;
  byte *pbVar13;
  long lVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar21;
  byte bVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  stbi_uc *psVar27;
  byte *pbVar28;
  ulong uVar29;
  bool bVar30;
  stbi_uc *local_f0;
  stbi_uc *local_d8;
  byte *local_d0;
  ulong local_70;
  ulong uVar20;
  
  uVar3 = (ulong)x;
  bVar30 = depth == 0x10;
  uVar6 = x * out_n;
  uVar7 = uVar6 << bVar30;
  a_00 = a->s->img_n;
  uVar8 = a_00 << bVar30;
  if (a_00 + 1 != out_n && a_00 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcoeurjo[P]axisampling/stb_image.h"
                  ,0x1139,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar11 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar30,0);
  a->out = psVar11;
  if (psVar11 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
  }
  else {
    iVar9 = stbi__mad3sizes_valid(a_00,x,depth,7);
    if (iVar9 == 0) {
      stbi__g_failure_reason = "too large";
    }
    else {
      uVar10 = a_00 * x;
      uVar19 = uVar10 * depth + 7 >> 3;
      uVar20 = (ulong)uVar19;
      if (raw_len < (uVar19 + 1) * y) {
        stbi__g_failure_reason = "not enough pixels";
      }
      else {
        lVar12 = (long)a_00;
        lVar24 = (long)(out_n << bVar30);
        lVar25 = -lVar24;
        lVar17 = -(ulong)uVar7;
        uVar21 = 0;
        uVar23 = 0;
        local_70 = uVar3;
        while( true ) {
          if (uVar23 == y) {
            if (7 < depth) {
              if (depth != 0x10) {
                return 1;
              }
              psVar11 = a->out;
              for (lVar12 = 0; uVar6 * y != (int)lVar12; lVar12 = lVar12 + 1) {
                puVar1 = (ushort *)(psVar11 + lVar12 * 2);
                *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
              }
              return 1;
            }
            uVar8 = 0;
            uVar23 = 0;
            do {
              if (uVar23 == y) {
                return 1;
              }
              bVar5 = 1;
              if (color == 0) {
                bVar5 = ""[depth];
              }
              uVar18 = (ulong)uVar8;
              psVar11 = a->out;
              uVar16 = (ulong)(uVar7 * (int)uVar23);
              if (depth == 4) {
                lVar12 = (uVar6 - uVar20) + uVar18;
                lVar17 = 0;
                for (uVar19 = uVar10; 1 < (int)uVar19; uVar19 = uVar19 - 2) {
                  psVar11[lVar17 * 2 + uVar18] = (psVar11[lVar17 + lVar12] >> 4) * bVar5;
                  psVar11[lVar17 * 2 + uVar18 + 1] = (psVar11[lVar17 + lVar12] & 0xf) * bVar5;
                  lVar17 = lVar17 + 1;
                }
                if (uVar19 == 1) {
                  psVar11[lVar17 * 2 + uVar18] = (psVar11[lVar17 + lVar12] >> 4) * bVar5;
                }
              }
              else {
                pbVar28 = psVar11 + ((uVar6 + uVar16) - uVar20);
                if (depth == 2) {
                  psVar11 = psVar11 + uVar18 + 3;
                  for (uVar19 = uVar10; 3 < (int)uVar19; uVar19 = uVar19 - 4) {
                    psVar11[-3] = (*pbVar28 >> 6) * bVar5;
                    psVar11[-2] = (*pbVar28 >> 4 & 3) * bVar5;
                    psVar11[-1] = (*pbVar28 >> 2 & 3) * bVar5;
                    *psVar11 = (*pbVar28 & 3) * bVar5;
                    pbVar28 = pbVar28 + 1;
                    psVar11 = psVar11 + 4;
                  }
                  if (((0 < (int)uVar19) && (psVar11[-3] = (*pbVar28 >> 6) * bVar5, uVar19 != 1)) &&
                     (psVar11[-2] = (*pbVar28 >> 4 & 3) * bVar5, uVar19 == 3)) {
                    psVar11[-1] = (*pbVar28 >> 2 & 3) * bVar5;
                  }
                }
                else if (depth == 1) {
                  pbVar13 = psVar11 + uVar18 + 7;
                  for (uVar19 = uVar10; 7 < (int)uVar19; uVar19 = uVar19 - 8) {
                    pbVar13[-7] = (char)*pbVar28 >> 7 & bVar5;
                    pbVar13[-6] = (char)(*pbVar28 * '\x02') >> 7 & bVar5;
                    pbVar13[-5] = (char)(*pbVar28 << 2) >> 7 & bVar5;
                    pbVar13[-4] = (char)(*pbVar28 << 3) >> 7 & bVar5;
                    pbVar13[-3] = (char)(*pbVar28 << 4) >> 7 & bVar5;
                    pbVar13[-2] = (char)(*pbVar28 << 5) >> 7 & bVar5;
                    pbVar13[-1] = (char)(*pbVar28 << 6) >> 7 & bVar5;
                    bVar22 = bVar5;
                    if ((*pbVar28 & 1) == 0) {
                      bVar22 = 0;
                    }
                    *pbVar13 = bVar22;
                    pbVar28 = pbVar28 + 1;
                    pbVar13 = pbVar13 + 8;
                  }
                  if (((((0 < (int)uVar19) &&
                        (pbVar13[-7] = (char)*pbVar28 >> 7 & bVar5, uVar19 != 1)) &&
                       ((pbVar13[-6] = (char)(*pbVar28 * '\x02') >> 7 & bVar5, 2 < uVar19 &&
                        ((pbVar13[-5] = (char)(*pbVar28 << 2) >> 7 & bVar5, uVar19 != 3 &&
                         (pbVar13[-4] = (char)(*pbVar28 << 3) >> 7 & bVar5, 4 < uVar19)))))) &&
                      (pbVar13[-3] = (char)(*pbVar28 << 4) >> 7 & bVar5, uVar19 != 5)) &&
                     (pbVar13[-2] = (char)(*pbVar28 << 5) >> 7 & bVar5, uVar19 == 7)) {
                    pbVar13[-1] = (char)(*pbVar28 << 6) >> 7 & bVar5;
                  }
                }
              }
              if (a_00 != out_n) {
                psVar11 = a->out;
                if (a_00 == 1) {
                  uVar19 = x * 2 - 1;
                  for (iVar9 = 0; -1 < (int)((x - 1) + iVar9); iVar9 = iVar9 + -1) {
                    psVar11[uVar19 + uVar16] = 0xff;
                    psVar11[(uVar19 - 1) + uVar16] =
                         psVar11[((x - 1) + iVar9 & 0x7fffffff) + uVar16];
                    uVar19 = uVar19 - 2;
                  }
                }
                else {
                  iVar9 = x - 1;
                  uVar18 = uVar3 * 3;
                  uVar19 = x * 4;
                  if (a_00 != 3) {
                    __assert_fail("img_n == 3",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dcoeurjo[P]axisampling/stb_image.h"
                                  ,0x11e6,
                                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                 );
                  }
                  while( true ) {
                    uVar18 = uVar18 - 3;
                    if (iVar9 < 0) break;
                    psVar11[(uVar19 - 1) + uVar16] = 0xff;
                    uVar29 = uVar18 & 0xffffffff;
                    psVar11[(uVar19 - 2) + uVar16] = psVar11[uVar29 + uVar16 + 2];
                    psVar11[(uVar19 - 3) + uVar16] = psVar11[uVar29 + uVar16 + 1];
                    psVar11[(uVar19 - 4) + uVar16] = psVar11[uVar29 + uVar16];
                    iVar9 = iVar9 + -1;
                    uVar19 = uVar19 - 4;
                  }
                }
              }
              uVar23 = uVar23 + 1;
              uVar8 = uVar8 + uVar7;
            } while( true );
          }
          uVar16 = (ulong)*raw;
          if (4 < uVar16) break;
          local_f0 = a->out + uVar7 * (int)uVar23;
          if (depth < 8) {
            if (x < uVar19) {
              __assert_fail("img_width_bytes <= x",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/dcoeurjo[P]axisampling/stb_image.h"
                            ,0x114f,
                            "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                           );
            }
            local_f0 = local_f0 + (uVar6 - uVar19);
            uVar8 = 1;
            local_70 = uVar20;
          }
          if (uVar23 == 0) {
            uVar16 = (ulong)""[uVar16];
          }
          uVar18 = 0;
          if (0 < (int)uVar8) {
            uVar18 = (ulong)uVar8;
          }
          for (uVar29 = 0; uVar18 != uVar29; uVar29 = uVar29 + 1) {
            switch(uVar16) {
            case 0:
            case 1:
            case 5:
            case 6:
              bVar5 = raw[uVar29 + 1];
              break;
            case 2:
              bVar5 = local_f0[uVar29 + lVar17];
              goto LAB_0012fc29;
            case 3:
              bVar5 = local_f0[uVar29 + lVar17] >> 1;
LAB_0012fc29:
              bVar5 = bVar5 + raw[uVar29 + 1];
              break;
            case 4:
              bVar5 = raw[uVar29 + 1];
              iVar9 = stbi__paeth(0,(uint)local_f0[uVar29 + lVar17],0);
              bVar5 = (char)iVar9 + bVar5;
              break;
            default:
              goto switchD_0012fbe2_default;
            }
            local_f0[uVar29] = bVar5;
switchD_0012fbe2_default:
          }
          lVar14 = (long)(int)uVar8;
          if (depth == 8) {
            lVar15 = (long)out_n;
            lVar2 = lVar12;
            if (a_00 != out_n) {
              local_f0[lVar12] = 0xff;
            }
LAB_0012fcac:
            local_d0 = raw + lVar2 + 1;
          }
          else {
            if (depth == 0x10) {
              lVar15 = lVar24;
              lVar2 = lVar14;
              if (a_00 != out_n) {
                local_f0[lVar14] = 0xff;
                local_f0[lVar14 + 1] = 0xff;
              }
              goto LAB_0012fcac;
            }
            local_d0 = raw + 2;
            lVar15 = 1;
          }
          psVar11 = local_f0 + lVar15;
          local_d8 = local_f0 + lVar15 + lVar17;
          if (depth < 8 || a_00 == out_n) {
            uVar26 = ((int)local_70 + -1) * uVar8;
            switch(uVar16) {
            case 0:
              memcpy(psVar11,local_d0,(long)(int)uVar26);
              break;
            case 1:
              uVar4 = uVar26;
              if ((int)uVar26 < 1) {
                uVar4 = 0;
              }
              for (uVar16 = 0; uVar4 != uVar16; uVar16 = uVar16 + 1) {
                psVar11[uVar16] = psVar11[uVar16 - lVar14] + local_d0[uVar16];
              }
              break;
            case 2:
              uVar4 = uVar26;
              if ((int)uVar26 < 1) {
                uVar4 = 0;
              }
              for (uVar16 = 0; uVar4 != uVar16; uVar16 = uVar16 + 1) {
                psVar11[uVar16] = psVar11[uVar16 + lVar17] + local_d0[uVar16];
              }
              break;
            case 3:
              uVar4 = uVar26;
              if ((int)uVar26 < 1) {
                uVar4 = 0;
              }
              uVar16 = (ulong)uVar4;
              pbVar28 = local_d0;
              while (bVar30 = uVar16 != 0, uVar16 = uVar16 - 1, bVar30) {
                *psVar11 = (char)((uint)psVar11[-lVar14] + (uint)psVar11[lVar17] >> 1) + *pbVar28;
                psVar11 = psVar11 + 1;
                pbVar28 = pbVar28 + 1;
              }
              break;
            case 4:
              uVar4 = uVar26;
              if ((int)uVar26 < 1) {
                uVar4 = 0;
              }
              for (uVar16 = 0; uVar16 != uVar4; uVar16 = uVar16 + 1) {
                bVar5 = local_d0[uVar16];
                iVar9 = stbi__paeth((uint)psVar11[uVar16 - lVar14],(uint)local_d8[uVar16],
                                    (uint)local_d8[uVar16 - lVar14]);
                psVar11[uVar16] = (char)iVar9 + bVar5;
              }
              break;
            case 5:
              uVar4 = uVar26;
              if ((int)uVar26 < 1) {
                uVar4 = 0;
              }
              for (uVar16 = 0; uVar4 != uVar16; uVar16 = uVar16 + 1) {
                psVar11[uVar16] = (psVar11[uVar16 - lVar14] >> 1) + local_d0[uVar16];
              }
              break;
            case 6:
              uVar4 = uVar26;
              if ((int)uVar26 < 1) {
                uVar4 = 0;
              }
              for (uVar16 = 0; uVar4 != uVar16; uVar16 = uVar16 + 1) {
                psVar11[uVar16] = psVar11[uVar16 - lVar14] + local_d0[uVar16];
              }
            }
            local_d0 = local_d0 + (int)uVar26;
          }
          else {
            if (a_00 + 1 != out_n) {
              __assert_fail("img_n+1 == out_n",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/dcoeurjo[P]axisampling/stb_image.h"
                            ,0x118d,
                            "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                           );
            }
            switch(uVar16) {
            case 0:
              uVar16 = uVar3;
              while (uVar26 = (int)uVar16 - 1, uVar16 = (ulong)uVar26, uVar26 != 0) {
                for (uVar29 = 0; uVar18 != uVar29; uVar29 = uVar29 + 1) {
                  psVar11[uVar29] = local_d0[uVar29];
                }
                psVar11[lVar14] = 0xff;
                local_d0 = local_d0 + lVar14;
                psVar11 = psVar11 + lVar24;
              }
              break;
            case 1:
              uVar16 = uVar3;
              while (uVar26 = (int)uVar16 - 1, uVar16 = (ulong)uVar26, uVar26 != 0) {
                for (uVar29 = 0; uVar18 != uVar29; uVar29 = uVar29 + 1) {
                  psVar11[uVar29] = psVar11[uVar29 + lVar25] + local_d0[uVar29];
                }
                psVar11[lVar14] = 0xff;
                local_d0 = local_d0 + lVar14;
                psVar11 = psVar11 + lVar24;
              }
              break;
            case 2:
              uVar16 = uVar3;
              while (uVar26 = (int)uVar16 - 1, uVar16 = (ulong)uVar26, uVar26 != 0) {
                for (uVar29 = 0; uVar18 != uVar29; uVar29 = uVar29 + 1) {
                  psVar11[uVar29] = psVar11[uVar29 + lVar17] + local_d0[uVar29];
                }
                psVar11[lVar14] = 0xff;
                local_d0 = local_d0 + lVar14;
                psVar11 = psVar11 + lVar24;
              }
              break;
            case 3:
              uVar16 = uVar3;
              while (uVar26 = (int)uVar16 - 1, uVar16 = (ulong)uVar26, pbVar28 = local_d0,
                    psVar27 = psVar11, uVar29 = uVar18, uVar26 != 0) {
                while (uVar29 != 0) {
                  *psVar27 = (char)((uint)psVar27[lVar25] + (uint)psVar27[lVar17] >> 1) + *pbVar28;
                  pbVar28 = pbVar28 + 1;
                  psVar27 = psVar27 + 1;
                  uVar29 = uVar29 - 1;
                }
                psVar11[lVar14] = 0xff;
                local_d0 = local_d0 + lVar14;
                psVar11 = psVar11 + lVar24;
              }
              break;
            case 4:
              psVar27 = local_f0 + lVar15 + lVar25;
              local_f0 = local_f0 + lVar15 + (lVar25 - (ulong)uVar7);
              uVar16 = uVar3;
              while (uVar26 = (int)uVar16 - 1, uVar26 != 0) {
                for (uVar16 = 0; uVar18 != uVar16; uVar16 = uVar16 + 1) {
                  bVar5 = local_d0[uVar16];
                  iVar9 = stbi__paeth((uint)psVar27[uVar16],(uint)local_d8[uVar16],
                                      (uint)local_f0[uVar16]);
                  psVar11[uVar16] = (char)iVar9 + bVar5;
                }
                psVar11[lVar14] = 0xff;
                local_d0 = local_d0 + lVar14;
                psVar11 = psVar11 + lVar24;
                local_d8 = local_d8 + lVar24;
                psVar27 = psVar27 + lVar24;
                local_f0 = local_f0 + lVar24;
                uVar16 = (ulong)uVar26;
              }
              break;
            case 5:
              uVar16 = uVar3;
              while (uVar26 = (int)uVar16 - 1, uVar16 = (ulong)uVar26, uVar26 != 0) {
                for (uVar29 = 0; uVar18 != uVar29; uVar29 = uVar29 + 1) {
                  psVar11[uVar29] = (psVar11[uVar29 + lVar25] >> 1) + local_d0[uVar29];
                }
                psVar11[lVar14] = 0xff;
                local_d0 = local_d0 + lVar14;
                psVar11 = psVar11 + lVar24;
              }
              break;
            case 6:
              uVar16 = uVar3;
              while (uVar26 = (int)uVar16 - 1, uVar16 = (ulong)uVar26, uVar26 != 0) {
                for (uVar29 = 0; uVar18 != uVar29; uVar29 = uVar29 + 1) {
                  psVar11[uVar29] = psVar11[uVar29 + lVar25] + local_d0[uVar29];
                }
                psVar11[lVar14] = 0xff;
                local_d0 = local_d0 + lVar14;
                psVar11 = psVar11 + lVar24;
              }
            }
            if (depth == 0x10) {
              psVar11 = a->out + (long)(int)(uVar8 + 1) + (ulong)uVar21;
              uVar16 = uVar3;
              while (iVar9 = (int)uVar16, uVar16 = (ulong)(iVar9 - 1), iVar9 != 0) {
                *psVar11 = 0xff;
                psVar11 = psVar11 + lVar24;
              }
            }
          }
          uVar23 = uVar23 + 1;
          uVar21 = uVar21 + uVar7;
          raw = local_d0;
        }
        stbi__g_failure_reason = "invalid filter";
      }
    }
  }
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   if (!stbi__mad3sizes_valid(img_n, x, depth, 7)) return stbi__err("too large", "Corrupt PNG");
   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;

   // we used to check for exact match between raw_len and img_len on non-interlaced PNGs,
   // but issue #276 reported a PNG in the wild that had extra data at the end (all zeros),
   // so just check for raw_len < img_len always.
   if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }